

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

string * __thiscall
iDynTree::InverseKinematics::linearSolverName_abi_cxx11_
          (string *__return_storage_ptr__,InverseKinematics *this)

{
  missingIpoptErrorReport();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string InverseKinematics::linearSolverName()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->m_solverName;
#else
        missingIpoptErrorReport();
        return {};
#endif
    }